

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O2

void __thiscall FC_BPNN::clear(FC_BPNN *this)

{
  pointer pvVar1;
  pointer pvVar2;
  long lVar3;
  pointer pdVar4;
  pointer pvVar5;
  int i;
  long lVar6;
  int j;
  long lVar7;
  
  pvVar1 = (this->layers_value).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->layers_value).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (lVar6 = 0; lVar6 != ((long)pvVar2 - (long)pvVar1) / 0x18; lVar6 = lVar6 + 1) {
    lVar3 = *(long *)&pvVar1[lVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl;
    pdVar4 = *(pointer *)
              ((long)&pvVar1[lVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl + 8)
    ;
    pvVar5 = (this->layers_error).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (lVar7 = 0; (long)pdVar4 - lVar3 >> 3 != lVar7; lVar7 = lVar7 + 1) {
      *(undefined8 *)(lVar3 + lVar7 * 8) = 0;
      *(undefined8 *)
       (*(long *)&pvVar5[lVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + lVar7 * 8) = 0;
    }
  }
  return;
}

Assistant:

void FC_BPNN::clear()
{
	for (int i = 0; i < layers_value.size(); i++) {
		for (int j = 0; j < layers_value[i].size(); j++) {
			layers_value[i][j] = 0.0;
			layers_error[i][j] = 0.0;
		}
	}
}